

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::FunctionPrototypeSyntax::getChild(FunctionPrototypeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  TokenOrSyntax *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffa8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,token);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x28),in_stack_ffffffffffffff98);
    break;
  case 2:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffffa8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,token_00);
    break;
  case 3:
    not_null<slang::syntax::DataTypeSyntax_*>::get
              ((not_null<slang::syntax::DataTypeSyntax_*> *)(in_RSI + 0x70));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 4:
    not_null<slang::syntax::NameSyntax_*>::get
              ((not_null<slang::syntax::NameSyntax_*> *)(in_RSI + 0x78));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 5:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax FunctionPrototypeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return &specifiers;
        case 2: return lifetime;
        case 3: return returnType.get();
        case 4: return name.get();
        case 5: return portList;
        default: return nullptr;
    }
}